

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

CURLcode Curl_resolv_blocking
                   (Curl_easy *data,char *hostname,int port,int ip_version,Curl_dns_entry **dnsentry
                   )

{
  CURLcode result;
  Curl_dns_entry **dnsentry_local;
  int ip_version_local;
  int port_local;
  char *hostname_local;
  Curl_easy *data_local;
  
  *dnsentry = (Curl_dns_entry *)0x0;
  data_local._4_4_ = Curl_resolv(data,hostname,port,ip_version,false,dnsentry);
  if (data_local._4_4_ == CURLE_OK) {
    data_local._4_4_ = CURLE_OK;
  }
  else if ((data_local._4_4_ == CURLE_AGAIN) &&
          ((data_local._4_4_ = Curl_async_await(data,dnsentry), data_local._4_4_ != CURLE_OK ||
           (*dnsentry == (Curl_dns_entry *)0x0)))) {
    Curl_conncontrol(data->conn,1);
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_resolv_blocking(struct Curl_easy *data,
                              const char *hostname,
                              int port,
                              int ip_version,
                              struct Curl_dns_entry **dnsentry)
{
  CURLcode result;

  *dnsentry = NULL;
  result = Curl_resolv(data, hostname, port, ip_version, FALSE, dnsentry);
  switch(result) {
  case CURLE_OK:
    DEBUGASSERT(*dnsentry);
    return CURLE_OK;
  case CURLE_AGAIN:
    DEBUGASSERT(!*dnsentry);
    result = Curl_async_await(data, dnsentry);
    if(result || !*dnsentry) {
      /* close the connection, since we cannot return failure here without
         cleaning up this connection properly. */
      connclose(data->conn, "async resolve failed");
    }
    return result;
  default:
    return result;
  }
}